

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_chroma_mode_18_34
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  UWORD8 *pUVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  iVar1 = 0x20;
  if (mode == 0x12) {
    iVar1 = -0x20;
  }
  uVar5 = 0;
  uVar4 = (ulong)(uint)nt;
  if (nt < 1) {
    uVar4 = uVar5;
  }
  pUVar2 = pu1_dst + 1;
  while (uVar5 != uVar4) {
    uVar5 = uVar5 + 1;
    iVar6 = ((int)uVar5 * iVar1 >> 4) + nt * 4;
    for (lVar3 = 0; lVar3 < nt * 2; lVar3 = lVar3 + 2) {
      pUVar2[lVar3 + -1] = pu1_ref[(long)(iVar6 + (int)lVar3) + 2];
      pUVar2[lVar3] = pu1_ref[(long)(iVar6 + (int)lVar3 + 1) + 2];
    }
    pUVar2 = pUVar2 + dst_strd;
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_18_34(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{
    WORD32 row, col;
    WORD32 intra_pred_ang;
    WORD32 idx = 0;
    UNUSED(src_strd);
    intra_pred_ang = 32; /*Default value*/
    /* For mode 18, angle is -45degree */
    if(mode == 18)
        intra_pred_ang = -32;
    /* For mode 34, angle is 45degree */
    else if(mode == 34)
        intra_pred_ang = 32;
    /* For the angle 45 and -45, replication is done from the corresponding angle */
    /* No interpolation is done for 45 degree*/
    for(row = 0; row < nt; row++)
    {
        idx = ((row + 1) * intra_pred_ang) >> 5;

        for(col = 0; col < (2 * nt); col += 2)
        {
            pu1_dst[col + (row * dst_strd)] = pu1_ref[(4 * nt) + col + 2 * idx + 2];
            pu1_dst[(col + 1) + (row * dst_strd)] = pu1_ref[(4 * nt) + (col + 1) + 2 * idx + 2];
        }

    }

}